

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O3

Result * validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetwork>
                   (Result *__return_storage_ptr__,ModelDescription *interface,NeuralNetwork *nn,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *outputBlobNames,bool isUpdatable)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  mapped_type_conflict1 mVar4;
  uint uVar5;
  Rep *pRVar6;
  pointer pcVar7;
  void *pvVar8;
  ModelDescription *pMVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  void **ppvVar11;
  RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription> RVar12;
  mapped_type_conflict1 *pmVar13;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this;
  ArrayFeatureType *pAVar14;
  ArrayFeatureType_EnumeratedShapes *pAVar15;
  iterator iVar16;
  _Rb_tree_node_base *p_Var17;
  long lVar18;
  long lVar19;
  undefined8 *puVar20;
  undefined7 in_register_00000081;
  long lVar21;
  Result *this_00;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  Result r;
  NeuralNetworkSpecValidator validator;
  NeuralNetworkShaper shaper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ioBlobNameToRank;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  inputBlobs;
  pointer local_230;
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  ModelDescription *local_208;
  Result *local_200;
  undefined1 local_1f8 [8];
  _Alloc_hider local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [72];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  undefined4 local_14c;
  void **local_148;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_140;
  undefined1 local_118 [8];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_60;
  
  local_14c = (undefined4)CONCAT71(in_register_00000081,isUpdatable);
  local_140 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)outputBlobNames;
  CoreML::Result::Result((Result *)&local_230);
  pRVar6 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar6->elements;
  if (pRVar6 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  lVar18 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar18 == 0) {
    bVar22 = true;
  }
  else {
    lVar21 = 0;
    do {
      puVar20 = *(undefined8 **)(*(long *)((long)ppvVar11 + lVar21) + 0x20);
      if (puVar20 == (undefined8 *)0x0) {
        puVar20 = &CoreML::Specification::_FeatureType_default_instance_;
      }
      bVar22 = *(int *)((long)puVar20 + 0x24) != 5;
    } while ((bVar22) && (bVar23 = lVar18 * 8 + -8 != lVar21, lVar21 = lVar21 + 8, bVar23));
  }
  iVar2 = nn->arrayinputshapemapping_;
  iVar3 = nn->imageinputshapemapping_;
  bVar23 = iVar3 == 0;
  pRVar6 = (nn->layers_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar6->elements;
  if (pRVar6 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  lVar18 = (long)(nn->layers_).super_RepeatedPtrFieldBase.current_size_;
  local_208 = interface;
  local_200 = __return_storage_ptr__;
  if (lVar18 == 0) {
LAB_004e403c:
    this_00 = local_200;
    pMVar9 = local_208;
    if (bVar22 || (iVar3 == 0 || iVar2 != 0)) {
      lVar18 = (long)(local_208->input_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar18 == 0) {
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"Neural networks require at least one input.","");
        CoreML::Result::Result(this_00,INVALID_MODEL_INTERFACE,(string *)local_1f8);
      }
      else if ((local_208->output_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"Neural networks produce at least one output.","");
        CoreML::Result::Result(this_00,INVALID_MODEL_INTERFACE,(string *)local_1f8);
      }
      else if ((nn->layers_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"Neural networks require at least one layer.","");
        CoreML::Result::Result(this_00,INVALID_MODEL_PARAMETERS,(string *)local_1f8);
      }
      else {
        pRVar6 = (local_208->input_).super_RepeatedPtrFieldBase.rep_;
        ppvVar11 = pRVar6->elements;
        if (pRVar6 == (Rep *)0x0) {
          ppvVar11 = (void **)0x0;
        }
        RVar12 = std::
                 __find_if<google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription_const>,__gnu_cxx::__ops::_Iter_negate<validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetwork>(CoreML::Specification::ModelDescription_const&,CoreML::Specification::NeuralNetwork_const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&,bool)::_lambda(CoreML::Specification::FeatureDescription_const&)_1_>>
                           (ppvVar11,ppvVar11 + lVar18);
        if (RVar12.it_ != ppvVar11 + lVar18) {
          local_1f8 = (undefined1  [8])local_1e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"inputs","");
          CoreML::validateInputOutputTypes
                    (this_00,&pMVar9->input_,MODEL_INPUT_TYPE_INVALID,(string *)local_1f8);
          if (local_1f8 != (undefined1  [8])local_1e8) {
            operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
          }
          bVar22 = CoreML::Result::good(this_00);
          if (!bVar22) goto LAB_004e461f;
          bVar22 = (bool)(iVar2 != 0 | bVar23 ^ 1U);
          pcVar7 = (this_00->m_message)._M_dataplus._M_p;
          paVar10 = &(this_00->m_message).field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar7 != paVar10) {
            operator_delete(pcVar7,paVar10->_M_allocated_capacity + 1);
          }
          local_90._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_90._M_impl.super__Rb_tree_header._M_header;
          local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_158 = paVar10;
          local_90._M_impl.super__Rb_tree_header._M_header._M_right =
               local_90._M_impl.super__Rb_tree_header._M_header._M_left;
          if (bVar22 != false) {
            pRVar6 = (local_208->input_).super_RepeatedPtrFieldBase.rep_;
            ppvVar11 = pRVar6->elements;
            if (pRVar6 == (Rep *)0x0) {
              ppvVar11 = (void **)0x0;
            }
            lVar18 = (long)(local_208->input_).super_RepeatedPtrFieldBase.current_size_;
            if (lVar18 != 0) {
              lVar21 = 0;
              do {
                lVar19 = *(long *)((long)ppvVar11 + lVar21);
                puVar20 = *(undefined8 **)(lVar19 + 0x20);
                if (puVar20 == (undefined8 *)0x0) {
                  puVar20 = &CoreML::Specification::_FeatureType_default_instance_;
                }
                if (*(int *)((long)puVar20 + 0x24) == 4) {
                  if (nn->imageinputshapemapping_ == 0) {
                    pmVar13 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                            *)&local_90,*(key_type **)(lVar19 + 0x10));
LAB_004e420b:
                    *pmVar13 = 5;
                  }
                  else {
                    pmVar13 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                            *)&local_90,*(key_type **)(lVar19 + 0x10));
                    *pmVar13 = 4;
                  }
                }
                else if (*(int *)((long)puVar20 + 0x24) == 5) {
                  if (nn->arrayinputshapemapping_ == 0) {
                    pmVar13 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                            *)&local_90,*(key_type **)(lVar19 + 0x10));
                    goto LAB_004e420b;
                  }
                  mVar4 = *(mapped_type_conflict1 *)(puVar20[3] + 0x10);
                  pmVar13 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                          *)&local_90,*(key_type **)(lVar19 + 0x10));
                  *pmVar13 = mVar4;
                }
                lVar21 = lVar21 + 8;
              } while (lVar18 * 8 != lVar21);
            }
            pRVar6 = (local_208->output_).super_RepeatedPtrFieldBase.rep_;
            ppvVar11 = pRVar6->elements;
            if (pRVar6 == (Rep *)0x0) {
              ppvVar11 = (void **)0x0;
            }
            lVar18 = (long)(local_208->output_).super_RepeatedPtrFieldBase.current_size_;
            if (lVar18 != 0) {
              lVar21 = 0;
              do {
                puVar20 = *(undefined8 **)(*(long *)((long)ppvVar11 + lVar21) + 0x20);
                if (puVar20 == (undefined8 *)0x0) {
                  puVar20 = &CoreML::Specification::_FeatureType_default_instance_;
                }
                if ((*(int *)((long)puVar20 + 0x24) == 5) &&
                   (iVar2 = *(int *)(puVar20[3] + 0x10), iVar2 != 0)) {
                  pmVar13 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                          *)&local_90,
                                         *(key_type **)(*(long *)((long)ppvVar11 + lVar21) + 0x10));
                  *pmVar13 = iVar2;
                }
                lVar21 = lVar21 + 8;
              } while (lVar18 * 8 != lVar21);
            }
          }
          p_Var1 = &local_60._M_impl.super__Rb_tree_header;
          local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
          pRVar6 = (local_208->input_).super_RepeatedPtrFieldBase.rep_;
          ppvVar11 = pRVar6->elements;
          if (pRVar6 == (Rep *)0x0) {
            ppvVar11 = (void **)0x0;
          }
          lVar18 = (long)(local_208->input_).super_RepeatedPtrFieldBase.current_size_;
          local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          if (lVar18 != 0) {
            local_148 = ppvVar11 + lVar18;
            do {
              pvVar8 = *ppvVar11;
              local_1f8 = (undefined1  [8])local_1e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"__input","");
              this = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      *)&local_60,*(key_type **)((long)pvVar8 + 0x10));
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_assign_unique<std::__cxx11::string_const*>
                        (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8);
              if (local_1f8 != (undefined1  [8])local_1e8) {
                operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
              }
              puVar20 = *(undefined8 **)((long)pvVar8 + 0x20);
              if (puVar20 == (undefined8 *)0x0) {
                puVar20 = &CoreML::Specification::_FeatureType_default_instance_;
              }
              if (*(int *)((long)puVar20 + 0x24) == 5) {
                if (bVar22 == false) {
                  lVar18 = puVar20[3];
                  uVar5 = *(uint *)(lVar18 + 0x10);
                  if ((0 < (int)uVar5) && ((uVar5 | 2) != 3)) {
                    local_1f8 = (undefined1  [8])local_1e8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,
                               "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                               ,"");
                    CoreML::Result::Result(this_00,INVALID_MODEL_INTERFACE,(string *)local_1f8);
LAB_004e4994:
                    if (local_1f8 != (undefined1  [8])local_1e8) {
                      operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
                    }
                    goto LAB_004e48ef;
                  }
                  iVar2 = *(int *)(lVar18 + 0x3c);
                  if (iVar2 == 0) {
LAB_004e4447:
                    if ((int)uVar5 < 1) {
LAB_004e4482:
                      local_1f8 = (undefined1  [8])local_1e8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,
                                 "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                                 ,"");
                      CoreML::Result::Result(this_00,INVALID_MODEL_INTERFACE,(string *)local_1f8);
                      goto LAB_004e4994;
                    }
                  }
                  else if (iVar2 == 0x15) {
                    lVar19 = *(long *)(*(long *)(lVar18 + 0x28) + 0x20);
                    lVar21 = lVar19 + 8;
                    if (lVar19 == 0) {
                      lVar21 = 0;
                    }
                    lVar18 = (long)*(int *)(*(long *)(lVar18 + 0x28) + 0x18);
                    if (lVar18 != 0) {
                      lVar19 = 0;
                      do {
                        if ((*(uint *)(*(long *)(lVar21 + lVar19) + 0x10) | 2) != 3)
                        goto LAB_004e4447;
                        lVar19 = lVar19 + 8;
                      } while (lVar18 * 8 != lVar19);
                    }
                  }
                  else if ((iVar2 == 0x1f) && (*(int *)(*(long *)(lVar18 + 0x28) + 0x18) != 1)) {
                    puVar20 = *(undefined8 **)((long)pvVar8 + 0x20);
                    if (puVar20 == (undefined8 *)0x0) {
                      puVar20 = &CoreML::Specification::_FeatureType_default_instance_;
                    }
                    if (*(int *)((long)puVar20 + 0x24) == 5) {
                      pAVar14 = (ArrayFeatureType *)puVar20[3];
                    }
                    else {
                      pAVar14 = CoreML::Specification::ArrayFeatureType::default_instance();
                    }
                    if (pAVar14->_oneof_case_[0] == 0x1f) {
                      pAVar15 = (pAVar14->ShapeFlexibility_).enumeratedshapes_;
                    }
                    else {
                      pAVar15 = (ArrayFeatureType_EnumeratedShapes *)
                                CoreML::Specification::ArrayFeatureType_ShapeRange::default_instance
                                          ();
                    }
                    if (((int)uVar5 < 1) &&
                       ((pAVar15->shapes_).super_RepeatedPtrFieldBase.current_size_ != 3))
                    goto LAB_004e4482;
                  }
                }
                else {
                  CoreML::validateNdMultiArrayInputType
                            ((Result *)local_1f8,(ArrayFeatureType *)puVar20[3]);
                  local_230 = (pointer)local_1f8;
                  std::__cxx11::string::operator=((string *)&local_228,(string *)&local_1f0);
                  bVar23 = CoreML::Result::good((Result *)&local_230);
                  if (local_1f0._M_p != local_1e8 + 8) {
                    operator_delete(local_1f0._M_p,local_1e8._8_8_ + 1);
                  }
                  if (!bVar23) {
                    *(pointer *)this_00 = local_230;
                    (this_00->m_message)._M_dataplus._M_p = (pointer)local_158;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_228._M_p == &local_218) {
                      local_158->_M_allocated_capacity =
                           CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0])
                      ;
                      *(undefined8 *)((long)local_158 + 8) = local_218._8_8_;
                    }
                    else {
                      (this_00->m_message)._M_dataplus._M_p = local_228._M_p;
                      (this_00->m_message).field_2._M_allocated_capacity =
                           CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0])
                      ;
                    }
                    (this_00->m_message)._M_string_length = local_220;
                    local_220 = 0;
                    local_218._M_local_buf[0] = '\0';
                    local_228._M_p = (pointer)&local_218;
                    goto LAB_004e48ef;
                  }
                }
              }
              ppvVar11 = ppvVar11 + 1;
            } while (ppvVar11 != local_148);
          }
          CoreML::NeuralNetworkSpecValidator::NeuralNetworkSpecValidator
                    ((NeuralNetworkSpecValidator *)local_1f8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)&local_60,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)&local_90,bVar22,0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)&local_90);
          CoreML::NeuralNetworkSpecValidator::
          validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
                    ((Result *)local_118,(NeuralNetworkSpecValidator *)local_1f8,nn);
          local_230 = (pointer)local_118;
          std::__cxx11::string::operator=((string *)&local_228,(string *)&local_110);
          paVar10 = local_158;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_p != local_100) {
            operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
          }
          bVar23 = CoreML::Result::good((Result *)&local_230);
          if (bVar23) {
            pMVar9 = local_208;
            p_Var17 = local_190._M_impl.super__Rb_tree_header._M_header._M_left;
            paVar10 = local_158;
            while (local_208 = pMVar9, local_158 = paVar10,
                  (_Rb_tree_header *)p_Var17 != &local_190._M_impl.super__Rb_tree_header) {
              iVar16 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ::find(&local_60,(key_type *)(p_Var17 + 1));
              if (((_Rb_tree_header *)iVar16._M_node == p_Var1) ||
                 ((_Base_ptr)0x1 < p_Var17[3]._M_parent)) {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          (local_140,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var17 + 1));
              }
              p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
              pMVar9 = local_208;
              paVar10 = local_158;
            }
            if (bVar22 == false) {
              CoreML::NeuralNetworkShaper::NeuralNetworkShaper
                        ((NeuralNetworkShaper *)local_118,pMVar9,&nn->layers_,true);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::~_Rb_tree(&local_e0);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                           *)&local_110);
            }
            bVar22 = CoreML::Result::good((Result *)&local_230);
            if ((bVar22) && ((char)local_14c != '\0')) {
              validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetwork>
                        ((Result *)local_118,nn);
              local_230 = (pointer)local_118;
              std::__cxx11::string::operator=((string *)&local_228,(string *)&local_110);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_p != local_100) {
                operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
              }
              bVar22 = CoreML::Result::good((Result *)&local_230);
              if (bVar22) {
                validateTrainingInputs<CoreML::Specification::NeuralNetwork>
                          ((Result *)local_118,pMVar9,nn);
                local_230 = (pointer)local_118;
                std::__cxx11::string::operator=((string *)&local_228,(string *)&local_110);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_p != local_100) {
                  operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
                }
                CoreML::Result::good((Result *)&local_230);
              }
            }
            *(pointer *)this_00 = local_230;
            (this_00->m_message)._M_dataplus._M_p = (pointer)paVar10;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_p == &local_218) {
              paVar10->_M_allocated_capacity =
                   CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]);
              *(undefined8 *)((long)paVar10 + 8) = local_218._8_8_;
            }
            else {
LAB_004e4898:
              (this_00->m_message)._M_dataplus._M_p = local_228._M_p;
              (this_00->m_message).field_2._M_allocated_capacity =
                   CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]);
            }
          }
          else {
            *(pointer *)this_00 = local_230;
            (this_00->m_message)._M_dataplus._M_p = (pointer)paVar10;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_p != &local_218) goto LAB_004e4898;
            paVar10->_M_allocated_capacity =
                 CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]);
            *(undefined8 *)((long)paVar10 + 8) = local_218._8_8_;
          }
          local_228._M_p = (pointer)&local_218;
          (this_00->m_message)._M_string_length = local_220;
          local_220 = 0;
          local_218._M_local_buf[0] = '\0';
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(&local_190);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)(local_1d8 + 0x18));
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)&local_1f0);
LAB_004e48ef:
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(&local_60);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::~_Rb_tree(&local_90);
          goto LAB_004e461f;
        }
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"Neural networks require at least one non-optional input.",""
                  );
        CoreML::Result::Result(this_00,INVALID_MODEL_INTERFACE,(string *)local_1f8);
      }
    }
    else {
      local_1f8 = (undefined1  [8])local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,
                 "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the image input Shape mapping is not \'RANK5_IMAGE_MAPPING\'"
                 ,"");
      this_00 = local_200;
      CoreML::Result::Result(local_200,INVALID_MODEL_INTERFACE,(string *)local_1f8);
    }
  }
  else {
    lVar21 = 0;
    do {
      bVar23 = CoreML::isIOS12NeuralNetworkLayer(*(NeuralNetworkLayer **)((long)ppvVar11 + lVar21));
      bVar24 = lVar18 * 8 + -8 != lVar21;
      lVar21 = lVar21 + 8;
    } while (bVar23 && bVar24);
    if ((bool)(iVar2 != 0 | bVar22) || bVar23) {
      bVar23 = iVar3 == 0 && bVar23;
      goto LAB_004e403c;
    }
    local_1f8 = (undefined1  [8])local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,
               "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the network contains a layer added in version 4 (iOS 13) or later. Use \'EXACT_ARRAY_MAPPING\' instead."
               ,"");
    this_00 = local_200;
    CoreML::Result::Result(local_200,INVALID_MODEL_INTERFACE,(string *)local_1f8);
  }
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
  }
LAB_004e461f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_p != &local_218) {
    operator_delete(local_228._M_p,
                    CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]) + 1);
  }
  return this_00;
}

Assistant:

Result validateNeuralNetworkTopLevel(const Specification::ModelDescription& interface,
                                     const T& nn, std::set<std::string>& outputBlobNames,
                                     bool isUpdatable) {
    Result r;
    
    // First calculate the value of the flag "ndArrayInterpretation"
    // ndArrayInterpretation == False ==> iOS 11/12 (old) execution path can be used, i.e. all tensors are static rank 5.
    // ndArrayInterpretation == True ==>  Tensors can have any rank (including 5).
    
    bool ndArrayInterpretation = false;

    bool hasNonIOS12Layer = false;
    bool hasNewArrayShapeMapping = false;
    bool hasNewImageShapeMapping = false;
    bool hasMultiArrayInput = false;

    for (const auto& input: interface.input()) {
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            hasMultiArrayInput = true;
            break;
        }
    }
    
    if (nn.arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
        hasNewArrayShapeMapping = true;
    }
    
    if (nn.imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
        hasNewImageShapeMapping = true;
    }
    
    for (const auto &layer: nn.layers()) {
        if (!isIOS12NeuralNetworkLayer(layer)) {
            hasNonIOS12Layer = true;
            break;
        }
    }
    
    if (hasNonIOS12Layer || hasNewArrayShapeMapping || hasNewImageShapeMapping) {
        ndArrayInterpretation = true;
    }
    
    if (hasNonIOS12Layer && !hasNewArrayShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the network contains a layer added in version 4 (iOS 13) or later. Use 'EXACT_ARRAY_MAPPING' instead.");
    }
    
    if (!hasNewArrayShapeMapping && hasNewImageShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the image input Shape mapping is not 'RANK5_IMAGE_MAPPING'");
    }
    
    //==================== End of logic to determine the value of "ndArrayInterpretation" ======================
    
    if (interface.input_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks require at least one input.");
    }
    
    if (interface.output_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks produce at least one output.");
    }
    
    if (nn.layers().size() == 0) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "Neural networks require at least one layer.");
    }
    
    if (std::all_of(interface.input().begin(), interface.input().end(),
                    [](const Specification::FeatureDescription& input) {
                        return input.type().isoptional();
                    })) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Neural networks require at least one non-optional input.");
                    }

    // Check the input types
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputTypes(interface.input(), ResultReason::MODEL_INPUT_TYPE_INVALID, "inputs"));

    std::map<std::string, int> ioBlobNameToRank; // to collect ranks of input/output blobs from the shapes present in the description
    
    // populate "ioBlobNameToRank"
    if (ndArrayInterpretation) {
        for (const auto& input: interface.input()) {
            if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (nn.arrayinputshapemapping() == Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = input.type().multiarraytype().shape_size();
                }
            } else if (input.type().Type_case() == Specification::FeatureType::kImageType) {
                if (nn.imageinputshapemapping() == Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = 4;
                }
            }
        }
        for (const auto& output: interface.output()) {
            if (output.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (output.type().multiarraytype().shape_size()) {
                    ioBlobNameToRank[output.name()] = output.type().multiarraytype().shape_size();
                }
            }
        }
    }
    
    // Collect Model input names and do some checking
    
    // inputBlobs: For each named data blob, the name of the node which produced it (there can be multiple in if-else branches)
    std::map<std::string, std::set<std::string>> inputBlobs;
    for (const auto& input: interface.input()) {
        // For input blobs, we'll give them a dummy producing layer name
        inputBlobs[input.name()] = {"__input"};
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            
            if (!ndArrayInterpretation) {
                
                // only vector-like (rank 1) or image-like (rank 3) inputs are allowed
                bool validShapeFound = false;
                if (input.type().multiarraytype().shape().size() > 0) {
                    if (!(input.type().multiarraytype().shape().size() == 1
                          || input.type().multiarraytype().shape().size() == 3)) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                    }
                    else {
                        validShapeFound = true;
                    }
                }
                bool flexibilityIsRank1or3 = true;
                switch (input.type().multiarraytype().ShapeFlexibility_case()) {
                    case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
                        for (const auto &shape : input.type().multiarraytype().enumeratedshapes().shapes()) {
                            if(shape.shape_size() != 1 && shape.shape_size() != 3) {
                                flexibilityIsRank1or3 = false;
                                break;
                            }
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kShapeRange:
                        flexibilityIsRank1or3 = (input.type().multiarraytype().shaperange().sizeranges_size() == 1 ||
                                                 input.type().multiarraytype().shaperange().sizeranges_size() == 3);
                        break;
                    case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                        flexibilityIsRank1or3 = false;
                        break;
                }
                if (!flexibilityIsRank1or3 && !validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                } else if (flexibilityIsRank1or3) {
                    validShapeFound = true;
                }
                if (!validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                }
                
            } else { // validate input shape when "ndArrayInterpretation" is True

                if (!(r = validateNdMultiArrayInputType(input.type().multiarraytype())).good()) {
                    return r;
                }
            } // if else block on spec version to check validity of input shape
        }
    }
    
    // validate the Neural Network message
    
    //  create an object to validate neural network message
    NeuralNetworkSpecValidator validator(inputBlobs, ioBlobNameToRank, ndArrayInterpretation, 0, ioBlobNameToRank);
    
    r = validator.validateNeuralNetwork(nn);
    
    if (!r.good()) {
        return r;
    }
    
    // gather all output blobs of the graph
    for (auto& blob: validator.blobs){
        if (inputBlobs.find(blob.first) == inputBlobs.end()) {
            outputBlobNames.insert(blob.first);
        } else {
            // if we are here, this means this blob is also present in the set of "inputBlobs"
            // but it can still be a genuine output blob if multiple layers are generating it (e.g. copy layer)
            if (blob.second.size() > 1) {
                outputBlobNames.insert(blob.first);
            }
        }
    }
    
    // Call the shaper: compatibility with iOS 12
    if (!ndArrayInterpretation) {
        // Compute the shapes
        try {
            NeuralNetworkShaper shaper(interface, nn.layers());
        }
        catch(std::runtime_error& e) {
            std::string err = std::string("Error determining network blob shapes: ") + std::string(e.what());
            return Result(ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES, err);
        }
    }
    
    if (!r.good()) {
        return r;
    }
    
    if (isUpdatable) {
        r = validateUpdatableNeuralNetwork(nn);
        if (!r.good()) { return r; }

        r = validateTrainingInputs(interface, nn);
        if (!r.good()) { return r; }
    }
    
    return r;
    
}